

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

bool __thiscall dg::llvmdg::DGCallGraphImpl::calls(DGCallGraphImpl *this,Function *F,Function *what)

{
  _Rb_tree_header *p_Var1;
  FuncNode **ppFVar2;
  _Base_ptr p_Var3;
  FuncNode *pFVar4;
  FuncNode *pFVar5;
  __normal_iterator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>_>
  _Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  
  p_Var1 = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = p_Var8;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[*(Function **)(p_Var7 + 1) < F]) {
    if (*(Function **)(p_Var7 + 1) >= F) {
      p_Var3 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var7 = p_Var3, F < *(Function **)(p_Var3 + 1))) {
    p_Var7 = &p_Var1->_M_header;
  }
  p_Var3 = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(Function **)(p_Var8 + 1) < what])
    {
      if (*(Function **)(p_Var8 + 1) >= what) {
        p_Var3 = p_Var8;
      }
    }
    p_Var8 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
       (p_Var8 = p_Var3, what < *(Function **)(p_Var3 + 1))) {
      p_Var8 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      pFVar4 = GenericCallGraph<dg::pta::PSNode_*>::get(this->_cg,(PSNode **)&p_Var7[1]._M_parent);
      pFVar5 = GenericCallGraph<dg::pta::PSNode_*>::get(this->_cg,(PSNode **)&p_Var8[1]._M_parent);
      if (pFVar4 == (FuncNode *)0x0) {
        return false;
      }
      if (pFVar5 == (FuncNode *)0x0) {
        return false;
      }
      ppFVar2 = *(FuncNode ***)(pFVar4 + 0x10);
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<dg::GenericCallGraph<dg::pta::PSNode*>::FuncNode*const*,std::vector<dg::GenericCallGraph<dg::pta::PSNode*>::FuncNode*,std::allocator<dg::GenericCallGraph<dg::pta::PSNode*>::FuncNode*>>>,__gnu_cxx::__ops::_Iter_pred<dg::GenericCallGraph<dg::pta::PSNode*>::FuncNode::_contains<std::vector<dg::GenericCallGraph<dg::pta::PSNode*>::FuncNode*,std::allocator<dg::GenericCallGraph<dg::pta::PSNode*>::FuncNode*>>>(dg::GenericCallGraph<dg::pta::PSNode*>::FuncNode_const*,std::vector<dg::GenericCallGraph<dg::pta::PSNode*>::FuncNode*,std::allocator<dg::GenericCallGraph<dg::pta::PSNode*>::FuncNode*>>const&)const::_lambda(dg::GenericCallGraph<dg::pta::PSNode*>::FuncNode*)_1_>>
                        (*(undefined8 *)(pFVar4 + 8),ppFVar2);
      return _Var6._M_current != ppFVar2;
    }
  }
  return false;
}

Assistant:

bool calls(const llvm::Function *F, const llvm::Function *what) override {
        auto it = _mapping.find(F);
        if (it == _mapping.end())
            return false;
        auto it2 = _mapping.find(what);
        if (it2 == _mapping.end())
            return false;
        const auto *fn1 = _cg.get(it->second);
        const auto *fn2 = _cg.get(it2->second);
        if (fn1 && fn2) {
            return fn1->calls(fn2);
        }
        return false;
    }